

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::delete_node(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
              *this,link_pointer prev)

{
  ptr_node<std::pair<const_unsigned_int,_double>_> *v;
  type *in_RSI;
  long in_RDI;
  node_pointer n;
  pointer in_stack_ffffffffffffffb8;
  value_base<std::pair<const_unsigned_int,_double>_> *local_30;
  
  if (*in_RSI == (type)0x0) {
    local_30 = (value_base<std::pair<const_unsigned_int,_double>_> *)0x0;
  }
  else {
    local_30 = (value_base<std::pair<const_unsigned_int,_double>_> *)((long)*in_RSI + -0x10);
  }
  *in_RSI = local_30[1].data_.data_.align_;
  v = (ptr_node<std::pair<const_unsigned_int,_double>_> *)
      node_alloc((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                  *)0x8d8a59);
  value_base<std::pair<const_unsigned_int,_double>_>::value_ptr(local_30);
  func::
  destroy_value_impl<std::allocator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>,std::pair<unsigned_int_const,double>>
            ((allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
              *)v,(pair<const_unsigned_int,_double> *)in_stack_ffffffffffffffb8);
  node_alloc((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
              *)0x8d8a7f);
  addressof<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>(v);
  allocator_traits<std::allocator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>>
  ::destroy<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>
            ((allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
              *)v,in_stack_ffffffffffffffb8);
  node_alloc((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
              *)0x8d8aa5);
  allocator_traits<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
  ::deallocate((allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
                *)v,in_stack_ffffffffffffffb8,0x8d8ab7);
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
  return;
}

Assistant:

void delete_node(link_pointer prev)
        {
            node_pointer n = static_cast<node_pointer>(prev->next_);
            prev->next_ = n->next_;

            boost::unordered::detail::func::destroy_value_impl(node_alloc(),
                n->value_ptr());
            node_allocator_traits::destroy(node_alloc(),
                    boost::addressof(*n));
            node_allocator_traits::deallocate(node_alloc(), n, 1);
            --size_;
        }